

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fixedEnvelopes.cpp
# Opt level: O3

void __thiscall
IsoSpec::FixedEnvelope::stochastic_init<true>
          (FixedEnvelope *this,Iso *iso,size_t _no_molecules,double _precision,double _beta_bias)

{
  double *pdVar1;
  double *pdVar2;
  IsoLayeredGenerator *this_00;
  bool bVar3;
  double *pdVar4;
  size_t sVar5;
  _Adaptor<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>,_double>
  __aurng;
  double dVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  double dVar9;
  double dVar10;
  IsoStochasticGenerator local_178;
  
  IsoStochasticGenerator::IsoStochasticGenerator(&local_178,iso,_no_molecules,_precision,_beta_bias)
  ;
  this->allDim = local_178.super_IsoGenerator.super_Iso.allDim;
  this->allDimSizeofInt = local_178.super_IsoGenerator.super_Iso.allDim << 2;
  reallocate_memory<true>(this,0x400);
  this_00 = &local_178.ILG;
  do {
    if (local_178.to_sample_left == 0) {
LAB_0011cccb:
      local_178.super_IsoGenerator.super_Iso._vptr_Iso =
           (_func_int **)&PTR__IsoStochasticGenerator_0012bbf0;
      IsoLayeredGenerator::~IsoLayeredGenerator(this_00);
      IsoGenerator::~IsoGenerator(&local_178.super_IsoGenerator);
      return;
    }
    if (local_178.confs_prob < local_178.chasing_prob) {
      local_178.current_count = 1;
      local_178.to_sample_left = local_178.to_sample_left - 1;
      while (pdVar1 = local_178.ILG.lProbs_ptr + 1, pdVar2 = local_178.ILG.lProbs_ptr + 1,
            pdVar4 = local_178.ILG.lProbs_ptr, local_178.ILG.lProbs_ptr = pdVar1,
            *pdVar2 < local_178.ILG.lcfmsv) {
        bVar3 = IsoLayeredGenerator::carry(this_00);
        if ((!bVar3) && (bVar3 = IsoLayeredGenerator::nextLayer(this_00,-2.0), !bVar3))
        goto LAB_0011cccb;
      }
      while (local_178.confs_prob =
                  local_178.ILG.super_IsoGenerator.partialProbs[1] *
                  ((*local_178.ILG.marginalResults)->probs).store
                  [(int)((ulong)((long)pdVar4 + (8 - (long)local_178.ILG.lProbs_ptr_start)) >> 3)] +
                  local_178.confs_prob, local_178.confs_prob <= local_178.chasing_prob) {
        while (pdVar1 = local_178.ILG.lProbs_ptr + 1, pdVar2 = local_178.ILG.lProbs_ptr + 1,
              pdVar4 = local_178.ILG.lProbs_ptr, local_178.ILG.lProbs_ptr = pdVar1,
              *pdVar2 < local_178.ILG.lcfmsv) {
          bVar3 = IsoLayeredGenerator::carry(this_00);
          if ((!bVar3) && (bVar3 = IsoLayeredGenerator::nextLayer(this_00,-2.0), !bVar3))
          goto LAB_0011cccb;
        }
      }
      if (local_178.to_sample_left != 0) {
        dVar6 = local_178.confs_prob - local_178.chasing_prob;
        goto LAB_0011cad6;
      }
      goto LAB_0011ccbb;
    }
    local_178.current_count = 0;
    while (local_178.ILG.lProbs_ptr[1] < local_178.ILG.lcfmsv) {
      local_178.ILG.lProbs_ptr = local_178.ILG.lProbs_ptr + 1;
      bVar3 = IsoLayeredGenerator::carry(this_00);
      if ((!bVar3) && (bVar3 = IsoLayeredGenerator::nextLayer(this_00,-2.0), !bVar3))
      goto LAB_0011cccb;
    }
    dVar6 = local_178.ILG.super_IsoGenerator.partialProbs[1] *
            ((*local_178.ILG.marginalResults)->probs).store
            [(int)((ulong)((long)local_178.ILG.lProbs_ptr +
                          (8 - (long)local_178.ILG.lProbs_ptr_start)) >> 3)];
    local_178.confs_prob = local_178.confs_prob + dVar6;
    local_178.ILG.lProbs_ptr = local_178.ILG.lProbs_ptr + 1;
LAB_0011cad6:
    dVar9 = local_178.precision - local_178.chasing_prob;
    auVar8._8_4_ = (int)(local_178.to_sample_left >> 0x20);
    auVar8._0_8_ = local_178.to_sample_left;
    auVar8._12_4_ = 0x45300000;
    dVar10 = (auVar8._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)local_178.to_sample_left) - 4503599627370496.0);
    if ((dVar6 * dVar10) / dVar9 <= local_178.beta_bias) {
      dVar6 = std::
              generate_canonical<double,53ul,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                        ((mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                          *)&random_gen);
      dVar6 = pow(dVar6 * (DAT_0012d9c8 - stdunif) + stdunif,1.0 / dVar10);
      for (dVar9 = (1.0 - dVar6) * dVar9; dVar6 = local_178.precision,
          dVar9 = dVar9 + local_178.chasing_prob, local_178.chasing_prob = dVar9,
          dVar9 <= local_178.confs_prob; dVar9 = (1.0 - dVar10) * (dVar6 - dVar9)) {
        local_178.current_count = local_178.current_count + 1;
        sVar5 = local_178.to_sample_left - 1;
        local_178.to_sample_left = sVar5;
        if (sVar5 == 0) goto LAB_0011ccbb;
        dVar10 = std::
                 generate_canonical<double,53ul,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                           ((mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                             *)&random_gen);
        auVar7._8_4_ = (int)(sVar5 >> 0x20);
        auVar7._0_8_ = sVar5;
        auVar7._12_4_ = 0x45300000;
        dVar10 = pow(dVar10 * (DAT_0012d9c8 - stdunif) + stdunif,
                     1.0 / ((auVar7._8_8_ - 1.9342813113834067e+25) +
                           ((double)CONCAT44(0x43300000,(int)sVar5) - 4503599627370496.0)));
      }
    }
    else {
      sVar5 = local_178.to_sample_left;
      if (dVar6 / dVar9 < 1.0) {
        sVar5 = boost_binomial_distribution_variate
                          (local_178.to_sample_left,dVar6 / dVar9,(mt19937 *)&random_gen);
      }
      local_178.to_sample_left = local_178.to_sample_left - sVar5;
      local_178.current_count = local_178.current_count + sVar5;
      local_178.chasing_prob = local_178.confs_prob;
    }
    if (local_178.current_count != 0) {
LAB_0011ccbb:
      addConfILG<true,IsoSpec::IsoStochasticGenerator>(this,&local_178);
    }
  } while( true );
}

Assistant:

void FixedEnvelope::stochastic_init(Iso&& iso, size_t _no_molecules, double _precision, double _beta_bias)
{
    IsoStochasticGenerator generator(std::move(iso), _no_molecules, _precision, _beta_bias);

    this->allDim = generator.getAllDim();
    this->allDimSizeofInt = this->allDim * sizeof(int);

    this->reallocate_memory<tgetConfs>(ISOSPEC_INIT_TABLE_SIZE);

    while(generator.advanceToNextConfiguration())
        addConfILG<tgetConfs, IsoStochasticGenerator>(generator);
}